

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaNormalTargetGenerator::WriteLinkRule(cmNinjaNormalTargetGenerator *this,bool useResponseFile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *pcVar2;
  size_type sVar3;
  bool bVar4;
  TargetType TVar5;
  TargetType targetType;
  int iVar6;
  cmGlobalNinjaGenerator *pcVar7;
  string *psVar8;
  char *pcVar9;
  undefined4 extraout_var;
  ostream *poVar10;
  size_t sVar11;
  cmOutputConverter *outputConverter;
  pointer __rhs;
  string langFlags;
  string responseFlag;
  string launcher;
  string targetVersionMinor;
  string targetVersionMajor;
  string linkCmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commandLines;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  auto_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  string rspfile;
  string rspcontent;
  string local_488;
  string ruleName;
  ostringstream description;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438 [6];
  ios_base local_3d8 [264];
  string local_2d0;
  string local_2b0;
  ostringstream comment;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280 [6];
  ios_base local_220 [264];
  RuleVariables vars;
  
  TVar5 = cmGeneratorTarget::GetType
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  LanguageLinkerRule_abi_cxx11_(&ruleName,this);
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  rspfile._M_string_length = 0;
  rspfile.field_2._M_local_buf[0] = '\0';
  rspcontent._M_dataplus._M_p = (pointer)&rspcontent.field_2;
  rspcontent._M_string_length = 0;
  rspcontent.field_2._M_local_buf[0] = '\0';
  pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar4 = cmGlobalNinjaGenerator::HasRule(pcVar7,&ruleName);
  if (!bVar4) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables(&vars);
    psVar8 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    vars.CMTargetName = (psVar8->_M_dataplus)._M_p;
    targetType = cmGeneratorTarget::GetType
                           ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                            GeneratorTarget);
    vars.CMTargetType = cmState::GetTargetTypeName(targetType);
    vars.Language = (this->TargetLinkLanguage)._M_dataplus._M_p;
    responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
    responseFlag._M_string_length = 0;
    responseFlag.field_2._M_local_buf[0] = '\0';
    if (useResponseFile) {
      _comment = (pointer)local_280;
      std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"CMAKE_","");
      std::__cxx11::string::_M_append
                ((char *)&comment,(ulong)(this->TargetLinkLanguage)._M_dataplus._M_p);
      _description = (pointer)local_438;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&description,_comment,_comment + local_288);
      std::__cxx11::string::append((char *)&description);
      pcVar9 = cmMakefile::GetDefinition
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          Makefile,(string *)&description);
      sVar3 = responseFlag._M_string_length;
      if (pcVar9 == (char *)0x0) {
        pcVar9 = "@";
      }
      else {
        strlen(pcVar9);
      }
      std::__cxx11::string::_M_replace((ulong)&responseFlag,0,(char *)sVar3,(ulong)pcVar9);
      std::__cxx11::string::_M_replace((ulong)&rspfile,0,(char *)rspfile._M_string_length,0x5788ad);
      std::__cxx11::string::_M_append((char *)&responseFlag,(ulong)rspfile._M_dataplus._M_p);
      pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      pcVar9 = "$in_newline";
      if (pcVar7->UsingGCCOnWindows != false) {
        pcVar9 = "$in";
      }
      std::__cxx11::string::_M_replace
                ((ulong)&rspcontent,0,(char *)rspcontent._M_string_length,(ulong)pcVar9);
      std::__cxx11::string::append((char *)&rspcontent);
      vars.Objects = responseFlag._M_dataplus._M_p;
      vars.LinkLibraries = "";
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_description != local_438) {
        operator_delete(_description,local_438[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_comment != local_280) {
        operator_delete(_comment,local_280[0]._M_allocated_capacity + 1);
      }
    }
    else {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    }
    vars.ObjectDir = "$OBJECT_DIR";
    vars.Target = "$TARGET_FILE";
    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetInstallNameDir = "$INSTALLNAME_DIR";
    vars.TargetPDB = "$TARGET_PDB";
    targetVersionMajor._M_dataplus._M_p = (pointer)&targetVersionMajor.field_2;
    targetVersionMajor._M_string_length = 0;
    targetVersionMajor.field_2._M_local_buf[0] = '\0';
    targetVersionMinor._M_dataplus._M_p = (pointer)&targetVersionMinor.field_2;
    targetVersionMinor._M_string_length = 0;
    targetVersionMinor.field_2._M_local_buf[0] = '\0';
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
    cmGeneratorTarget::GetTargetVersion
              ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               (int *)&launcher,(int *)&linkCmd);
    std::ostream::operator<<(&comment,(int)launcher._M_dataplus._M_p);
    std::ostream::operator<<(&description,(int)linkCmd._M_dataplus._M_p);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&targetVersionMajor,(string *)&langFlags);
    paVar1 = &langFlags.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)langFlags._M_dataplus._M_p != paVar1) {
      operator_delete(langFlags._M_dataplus._M_p,
                      CONCAT71(langFlags.field_2._M_allocated_capacity._1_7_,
                               langFlags.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&targetVersionMinor,(string *)&langFlags);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)langFlags._M_dataplus._M_p != paVar1) {
      operator_delete(langFlags._M_dataplus._M_p,
                      CONCAT71(langFlags.field_2._M_allocated_capacity._1_7_,
                               langFlags.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
    std::ios_base::~ios_base(local_3d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
    std::ios_base::~ios_base(local_220);
    vars.TargetVersionMajor = targetVersionMajor._M_dataplus._M_p;
    vars.TargetVersionMinor = targetVersionMinor._M_dataplus._M_p;
    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";
    langFlags._M_string_length = 0;
    langFlags.field_2._M_local_buf[0] = '\0';
    langFlags._M_dataplus._M_p = (pointer)paVar1;
    if (TVar5 != EXECUTABLE) {
      std::__cxx11::string::append((char *)&langFlags);
      vars.LanguageCompileFlags = langFlags._M_dataplus._M_p;
    }
    launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
    launcher._M_string_length = 0;
    launcher.field_2._M_local_buf[0] = '\0';
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    _comment = (pointer)local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"RULE_LAUNCH_LINK","");
    pcVar9 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar2,target,(string *)&comment)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_280) {
      operator_delete(_comment,local_280[0]._M_allocated_capacity + 1);
    }
    sVar3 = launcher._M_string_length;
    if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
      strlen(pcVar9);
      std::__cxx11::string::_M_replace((ulong)&launcher,0,(char *)sVar3,(ulong)pcVar9);
      std::__cxx11::string::append((char *)&launcher);
    }
    iVar6 = (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
              super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
    rulePlaceholderExpander.x_ = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar6);
    ComputeLinkCmd_abi_cxx11_(&linkCmds,this);
    if (linkCmds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        linkCmds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __rhs = linkCmds.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment
                       ,&launcher,__rhs);
        std::__cxx11::string::operator=((string *)__rhs,(string *)&comment);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_comment != local_280) {
          operator_delete(_comment,local_280[0]._M_allocated_capacity + 1);
        }
        pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
        outputConverter =
             &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
        if (pcVar2 == (cmLocalNinjaGenerator *)0x0) {
          outputConverter = (cmOutputConverter *)0x0;
        }
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (rulePlaceholderExpander.x_,outputConverter,__rhs,&vars);
        __rhs = __rhs + 1;
      } while (__rhs != linkCmds.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,cmNinjaRemoveNoOpCommands>
              (&linkCmds);
    _comment = (pointer)local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"$PRE_LINK","");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(&linkCmds,
                     (const_iterator)
                     linkCmds.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(value_type *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_280) {
      operator_delete(_comment,local_280[0]._M_allocated_capacity + 1);
    }
    _comment = (pointer)local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"$POST_BUILD","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&linkCmds,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_280) {
      operator_delete(_comment,local_280[0]._M_allocated_capacity + 1);
    }
    cmLocalNinjaGenerator::BuildCommandLine
              (&linkCmd,(this->super_cmNinjaTargetGenerator).LocalGenerator,&linkCmds);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&comment,"Rule for linking ",0x11)
    ;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&comment,(this->TargetLinkLanguage)._M_dataplus._M_p,
                         (this->TargetLinkLanguage)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    pcVar9 = GetVisibleTypeName(this);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
    }
    else {
      sVar11 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar9,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&description,"Linking ",8);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&description,(this->TargetLinkLanguage)._M_dataplus._M_p,
                         (this->TargetLinkLanguage)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    pcVar9 = GetVisibleTypeName(this);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
    }
    else {
      sVar11 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar9,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," $TARGET_FILE",0xd);
    pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"");
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"");
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"$RESTAT","");
    cmGlobalNinjaGenerator::AddRule
              (pcVar7,&ruleName,&linkCmd,(string *)&local_508,(string *)&commandLines,&local_488,
               &local_2b0,&rspfile,&rspcontent,&local_2d0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    if (commandLines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&commandLines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(commandLines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((commandLines.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_allocated_capacity != &local_4f8) {
      operator_delete((void *)local_508._M_allocated_capacity,local_4f8._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
    std::ios_base::~ios_base(local_3d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
    std::ios_base::~ios_base(local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkCmd._M_dataplus._M_p != &linkCmd.field_2) {
      operator_delete(linkCmd._M_dataplus._M_p,linkCmd.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&linkCmds);
    cm::auto_ptr<cmRulePlaceholderExpander>::~auto_ptr(&rulePlaceholderExpander);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)launcher._M_dataplus._M_p != &launcher.field_2) {
      operator_delete(launcher._M_dataplus._M_p,
                      CONCAT71(launcher.field_2._M_allocated_capacity._1_7_,
                               launcher.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)langFlags._M_dataplus._M_p != &langFlags.field_2) {
      operator_delete(langFlags._M_dataplus._M_p,
                      CONCAT71(langFlags.field_2._M_allocated_capacity._1_7_,
                               langFlags.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetVersionMinor._M_dataplus._M_p != &targetVersionMinor.field_2) {
      operator_delete(targetVersionMinor._M_dataplus._M_p,
                      CONCAT71(targetVersionMinor.field_2._M_allocated_capacity._1_7_,
                               targetVersionMinor.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetVersionMajor._M_dataplus._M_p != &targetVersionMajor.field_2) {
      operator_delete(targetVersionMajor._M_dataplus._M_p,
                      CONCAT71(targetVersionMajor.field_2._M_allocated_capacity._1_7_,
                               targetVersionMajor.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)responseFlag._M_dataplus._M_p != &responseFlag.field_2) {
      operator_delete(responseFlag._M_dataplus._M_p,
                      CONCAT71(responseFlag.field_2._M_allocated_capacity._1_7_,
                               responseFlag.field_2._M_local_buf[0]) + 1);
    }
  }
  sVar11 = (this->TargetNameOut)._M_string_length;
  if (((sVar11 != (this->TargetNameReal)._M_string_length) ||
      ((sVar11 != 0 &&
       (iVar6 = bcmp((this->TargetNameOut)._M_dataplus._M_p,(this->TargetNameReal)._M_dataplus._M_p,
                     sVar11), iVar6 != 0)))) &&
     (bVar4 = cmGeneratorTarget::IsFrameworkOnApple
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget), !bVar4)) {
    pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&comment,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar8,SHELL);
    if (TVar5 == EXECUTABLE) {
      commandLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      commandLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      commandLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _description = (pointer)local_438;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&description,_comment,_comment + local_288);
      std::__cxx11::string::append((char *)&description);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLines,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_description != local_438) {
        operator_delete(_description,local_438[0]._M_allocated_capacity + 1);
      }
      _description = (pointer)local_438;
      std::__cxx11::string::_M_construct<char_const*>((string *)&description,"$POST_BUILD","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLines,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_description != local_438) {
        operator_delete(_description,local_438[0]._M_allocated_capacity + 1);
      }
      pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      _description = (pointer)local_438;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&description,"CMAKE_SYMLINK_EXECUTABLE","");
      cmLocalNinjaGenerator::BuildCommandLine
                ((string *)&vars,(this->super_cmNinjaTargetGenerator).LocalGenerator,&commandLines);
      responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&responseFlag,"Creating executable symlink $out","");
      targetVersionMajor._M_dataplus._M_p = (pointer)&targetVersionMajor.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&targetVersionMajor,"Rule for creating executable symlink.","");
      targetVersionMinor._M_dataplus._M_p = (pointer)&targetVersionMinor.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&targetVersionMinor,"");
      langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&langFlags,"");
      launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&launcher,"");
      linkCmd._M_dataplus._M_p = (pointer)&linkCmd.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&linkCmd,"");
      local_508._M_allocated_capacity = (size_type)&local_4f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"");
      cmGlobalNinjaGenerator::AddRule
                (pcVar7,(string *)&description,(string *)&vars,&responseFlag,&targetVersionMajor,
                 &targetVersionMinor,&langFlags,&launcher,&linkCmd,(string *)&local_508,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_allocated_capacity != &local_4f8) {
        operator_delete((void *)local_508._M_allocated_capacity,local_4f8._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkCmd._M_dataplus._M_p != &linkCmd.field_2) {
        operator_delete(linkCmd._M_dataplus._M_p,linkCmd.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)launcher._M_dataplus._M_p != &launcher.field_2) {
        operator_delete(launcher._M_dataplus._M_p,
                        CONCAT71(launcher.field_2._M_allocated_capacity._1_7_,
                                 launcher.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)langFlags._M_dataplus._M_p != &langFlags.field_2) {
        operator_delete(langFlags._M_dataplus._M_p,
                        CONCAT71(langFlags.field_2._M_allocated_capacity._1_7_,
                                 langFlags.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetVersionMinor._M_dataplus._M_p != &targetVersionMinor.field_2) {
        operator_delete(targetVersionMinor._M_dataplus._M_p,
                        CONCAT71(targetVersionMinor.field_2._M_allocated_capacity._1_7_,
                                 targetVersionMinor.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetVersionMajor._M_dataplus._M_p != &targetVersionMajor.field_2) {
        operator_delete(targetVersionMajor._M_dataplus._M_p,
                        CONCAT71(targetVersionMajor.field_2._M_allocated_capacity._1_7_,
                                 targetVersionMajor.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)responseFlag._M_dataplus._M_p != &responseFlag.field_2) {
        operator_delete(responseFlag._M_dataplus._M_p,
                        CONCAT71(responseFlag.field_2._M_allocated_capacity._1_7_,
                                 responseFlag.field_2._M_local_buf[0]) + 1);
      }
      if ((char **)vars.CMTargetName != &vars.TargetPDB) {
        operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_description != local_438) {
        operator_delete(_description,local_438[0]._M_allocated_capacity + 1);
      }
    }
    else {
      commandLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      commandLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      commandLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _description = (pointer)local_438;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&description,_comment,_comment + local_288);
      std::__cxx11::string::append((char *)&description);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLines,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_description != local_438) {
        operator_delete(_description,local_438[0]._M_allocated_capacity + 1);
      }
      _description = (pointer)local_438;
      std::__cxx11::string::_M_construct<char_const*>((string *)&description,"$POST_BUILD","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLines,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_description != local_438) {
        operator_delete(_description,local_438[0]._M_allocated_capacity + 1);
      }
      pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      _description = (pointer)local_438;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&description,"CMAKE_SYMLINK_LIBRARY","");
      cmLocalNinjaGenerator::BuildCommandLine
                ((string *)&vars,(this->super_cmNinjaTargetGenerator).LocalGenerator,&commandLines);
      responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&responseFlag,"Creating library symlink $out","");
      targetVersionMajor._M_dataplus._M_p = (pointer)&targetVersionMajor.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&targetVersionMajor,"Rule for creating library symlink.","");
      targetVersionMinor._M_dataplus._M_p = (pointer)&targetVersionMinor.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&targetVersionMinor,"");
      langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&langFlags,"");
      launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&launcher,"");
      linkCmd._M_dataplus._M_p = (pointer)&linkCmd.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&linkCmd,"");
      local_508._M_allocated_capacity = (size_type)&local_4f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"");
      cmGlobalNinjaGenerator::AddRule
                (pcVar7,(string *)&description,(string *)&vars,&responseFlag,&targetVersionMajor,
                 &targetVersionMinor,&langFlags,&launcher,&linkCmd,(string *)&local_508,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_allocated_capacity != &local_4f8) {
        operator_delete((void *)local_508._M_allocated_capacity,local_4f8._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkCmd._M_dataplus._M_p != &linkCmd.field_2) {
        operator_delete(linkCmd._M_dataplus._M_p,linkCmd.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)launcher._M_dataplus._M_p != &launcher.field_2) {
        operator_delete(launcher._M_dataplus._M_p,
                        CONCAT71(launcher.field_2._M_allocated_capacity._1_7_,
                                 launcher.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)langFlags._M_dataplus._M_p != &langFlags.field_2) {
        operator_delete(langFlags._M_dataplus._M_p,
                        CONCAT71(langFlags.field_2._M_allocated_capacity._1_7_,
                                 langFlags.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetVersionMinor._M_dataplus._M_p != &targetVersionMinor.field_2) {
        operator_delete(targetVersionMinor._M_dataplus._M_p,
                        CONCAT71(targetVersionMinor.field_2._M_allocated_capacity._1_7_,
                                 targetVersionMinor.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetVersionMajor._M_dataplus._M_p != &targetVersionMajor.field_2) {
        operator_delete(targetVersionMajor._M_dataplus._M_p,
                        CONCAT71(targetVersionMajor.field_2._M_allocated_capacity._1_7_,
                                 targetVersionMajor.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)responseFlag._M_dataplus._M_p != &responseFlag.field_2) {
        operator_delete(responseFlag._M_dataplus._M_p,
                        CONCAT71(responseFlag.field_2._M_allocated_capacity._1_7_,
                                 responseFlag.field_2._M_local_buf[0]) + 1);
      }
      if ((char **)vars.CMTargetName != &vars.TargetPDB) {
        operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_description != local_438) {
        operator_delete(_description,local_438[0]._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commandLines);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_280) {
      operator_delete(_comment,local_280[0]._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspcontent._M_dataplus._M_p != &rspcontent.field_2) {
    operator_delete(rspcontent._M_dataplus._M_p,
                    CONCAT71(rspcontent.field_2._M_allocated_capacity._1_7_,
                             rspcontent.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,
                    CONCAT71(rspfile.field_2._M_allocated_capacity._1_7_,
                             rspfile.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ruleName._M_dataplus._M_p != &ruleName.field_2) {
    operator_delete(ruleName._M_dataplus._M_p,ruleName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkRule(bool useResponseFile)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();
  std::string ruleName = this->LanguageLinkerRule();

  // Select whether to use a response file for objects.
  std::string rspfile;
  std::string rspcontent;

  if (!this->GetGlobalGenerator()->HasRule(ruleName)) {
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType =
      cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());

    vars.Language = this->TargetLinkLanguage.c_str();

    std::string responseFlag;
    if (!useResponseFile) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      std::string cmakeVarLang = "CMAKE_";
      cmakeVarLang += this->TargetLinkLanguage;

      // build response file name
      std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
      const char* flag = GetMakefile()->GetDefinition(cmakeLinkVar);
      if (flag) {
        responseFlag = flag;
      } else {
        responseFlag = "@";
      }
      rspfile = "$RSP_FILE";
      responseFlag += rspfile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rspcontent = "$in";
      } else {
        rspcontent = "$in_newline";
      }
      rspcontent += " $LINK_PATH $LINK_LIBRARIES";
      vars.Objects = responseFlag.c_str();
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetInstallNameDir = "$INSTALLNAME_DIR";
    vars.TargetPDB = "$TARGET_PDB";

    // Setup the target version.
    std::string targetVersionMajor;
    std::string targetVersionMinor;
    {
      std::ostringstream majorStream;
      std::ostringstream minorStream;
      int major;
      int minor;
      this->GetGeneratorTarget()->GetTargetVersion(major, minor);
      majorStream << major;
      minorStream << minor;
      targetVersionMajor = majorStream.str();
      targetVersionMinor = minorStream.str();
    }
    vars.TargetVersionMajor = targetVersionMajor.c_str();
    vars.TargetVersionMinor = targetVersionMinor.c_str();

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string launcher;
    const char* val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    CM_AUTO_PTR<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeLinkCmd();
    for (std::vector<std::string>::iterator i = linkCmds.begin();
         i != linkCmds.end(); ++i) {
      *i = launcher + *i;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   *i, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cmEraseIf(linkCmds, cmNinjaRemoveNoOpCommands());

    linkCmds.insert(linkCmds.begin(), "$PRE_LINK");
    linkCmds.push_back("$POST_BUILD");
    std::string linkCmd =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds);

    // Write the linker rule with response file if needed.
    std::ostringstream comment;
    comment << "Rule for linking " << this->TargetLinkLanguage << " "
            << this->GetVisibleTypeName() << ".";
    std::ostringstream description;
    description << "Linking " << this->TargetLinkLanguage << " "
                << this->GetVisibleTypeName() << " $TARGET_FILE";
    this->GetGlobalGenerator()->AddRule(ruleName, linkCmd, description.str(),
                                        comment.str(),
                                        /*depfile*/ "",
                                        /*deptype*/ "", rspfile, rspcontent,
                                        /*restat*/ "$RESTAT",
                                        /*generator*/ false);
  }

  if (this->TargetNameOut != this->TargetNameReal &&
      !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    if (targetType == cmStateEnums::EXECUTABLE) {
      std::vector<std::string> commandLines;
      commandLines.push_back(cmakeCommand +
                             " -E cmake_symlink_executable $in $out");
      commandLines.push_back("$POST_BUILD");

      this->GetGlobalGenerator()->AddRule(
        "CMAKE_SYMLINK_EXECUTABLE",
        this->GetLocalGenerator()->BuildCommandLine(commandLines),
        "Creating executable symlink $out", "Rule for creating "
                                            "executable symlink.",
        /*depfile*/ "",
        /*deptype*/ "",
        /*rspfile*/ "",
        /*rspcontent*/ "",
        /*restat*/ "",
        /*generator*/ false);
    } else {
      std::vector<std::string> commandLines;
      commandLines.push_back(cmakeCommand +
                             " -E cmake_symlink_library $in $SONAME $out");
      commandLines.push_back("$POST_BUILD");

      this->GetGlobalGenerator()->AddRule(
        "CMAKE_SYMLINK_LIBRARY",
        this->GetLocalGenerator()->BuildCommandLine(commandLines),
        "Creating library symlink $out", "Rule for creating "
                                         "library symlink.",
        /*depfile*/ "",
        /*deptype*/ "",
        /*rspfile*/ "",
        /*rspcontent*/ "",
        /*restat*/ "",
        /*generator*/ false);
    }
  }
}